

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Padding_x86_avx512::forward
          (Padding_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  long lVar2;
  undefined1 auVar3 [64];
  uint uVar4;
  int *piVar5;
  size_t sVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [40];
  __m512 afVar10;
  __m512 afVar11;
  undefined1 auVar12 [48];
  Option OVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  sbyte sVar19;
  int iVar20;
  float fVar21;
  Mat *pMVar22;
  ulong uVar23;
  Mat *pMVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  undefined1 (*pauVar29) [32];
  undefined1 (*pauVar30) [64];
  int iVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  undefined1 (*pauVar35) [32];
  undefined1 (*pauVar36) [64];
  ulong uVar37;
  uint uVar38;
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  uint _c;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  __m512 pad_value;
  Option opt_pack1;
  undefined1 local_180 [8];
  undefined8 uStack_178;
  undefined8 uStack_170;
  float fStack_168;
  float fStack_164;
  Allocator *pAStack_160;
  int iStack_158;
  float fStack_154;
  float fStack_150;
  undefined8 uStack_14c;
  float fStack_144;
  size_t local_140;
  Mat *local_110;
  ulong local_108;
  undefined1 local_100 [64];
  undefined1 local_c0 [8];
  undefined8 uStack_b8;
  undefined1 auStack_b0 [48];
  
  afVar10 = _local_180;
  auVar12 = _uStack_170;
  uVar25 = (this->super_Padding).top;
  uVar32 = (this->super_Padding).bottom;
  uVar4 = (this->super_Padding).left;
  uVar27 = (this->super_Padding).right;
  uVar33 = (this->super_Padding).front;
  iVar14 = (this->super_Padding).behind;
  if ((((uVar4 == 0 && uVar27 == 0) && (uVar25 == 0 && uVar32 == 0)) && uVar33 == 0) && iVar14 == 0)
  {
    if (top_blob != bottom_blob) {
      piVar5 = bottom_blob->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = top_blob->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar5 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar5;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar14 = bottom_blob->w;
      iVar20 = bottom_blob->h;
      iVar15 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar14;
      top_blob->h = iVar20;
      top_blob->d = iVar15;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    return 0;
  }
  iVar20 = bottom_blob->elempack;
  uVar34 = bottom_blob->elemsize;
  if (iVar20 == 0) {
    iVar31 = bottom_blob->w;
    iVar16 = bottom_blob->h;
    iVar26 = bottom_blob->d;
    _c = bottom_blob->c;
    iVar15 = bottom_blob->dims;
  }
  else {
    if (((int)uVar34 * 8) / iVar20 == 8) {
      iVar14 = forward_int8(this,bottom_blob,top_blob,opt);
      return iVar14;
    }
    iVar31 = bottom_blob->w;
    iVar16 = bottom_blob->h;
    iVar26 = bottom_blob->d;
    _c = bottom_blob->c;
    iVar15 = bottom_blob->dims;
    local_110 = bottom_blob;
    if (iVar20 == 4) {
      _uStack_170 = auVar12;
      switch(iVar15) {
      case 1:
        iVar15 = 1;
        if ((((uVar4 & 3) == 0) && (uVar25 = uVar4 + iVar31 * 4 + uVar27, (uVar25 & 7) == 4)) &&
           ((this->super_Padding).type == 0)) {
          Mat::create(top_blob,(int)uVar25 >> 2,(uVar34 >> 2) << ((uVar27 & 3) == 0) * '\x02',4,
                      opt->blob_allocator);
          if ((Mat *)top_blob->data == (Mat *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            local_180._4_4_ = (this->super_Padding).value;
            local_180._0_4_ = local_180._4_4_;
            uStack_178._0_4_ = (float)local_180._4_4_;
            uStack_178._4_4_ = (float)local_180._4_4_;
            iVar14 = (this->super_Padding).left;
            iVar20 = iVar14 + 3;
            if (-1 < iVar14) {
              iVar20 = iVar14;
            }
            iVar14 = (this->super_Padding).right;
            iVar15 = iVar14 + 3;
            if (-1 < iVar14) {
              iVar15 = iVar14;
            }
            padding_constant_pack4_sse
                      ((ncnn *)local_110,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,0,0,
                       iVar20 >> 2,iVar15 >> 2,(__m128 *)local_180);
            return 0;
          }
          return -100;
        }
        break;
      case 2:
        iVar15 = 2;
        if ((((uVar25 & 3) == 0) && (uVar25 = uVar25 + iVar16 * 4 + uVar32, (uVar25 & 7) == 4)) &&
           ((this->super_Padding).type == 0)) {
          Mat::create(top_blob,uVar4 + uVar27 + iVar31,(int)uVar25 >> 2,
                      (uVar34 >> 2) << ((uVar32 & 3) == 0) * '\x02',4,opt->blob_allocator);
          if ((Mat *)top_blob->data == (Mat *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            local_180._4_4_ = (this->super_Padding).value;
            local_180._0_4_ = local_180._4_4_;
            uStack_178._0_4_ = (float)local_180._4_4_;
            uStack_178._4_4_ = (float)local_180._4_4_;
            iVar14 = (this->super_Padding).top;
            iVar20 = (this->super_Padding).bottom;
            iVar15 = iVar14 + 3;
            if (-1 < iVar14) {
              iVar15 = iVar14;
            }
            iVar14 = iVar20 + 3;
            if (-1 < iVar20) {
              iVar14 = iVar20;
            }
            padding_constant_pack4_sse
                      ((ncnn *)local_110,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,
                       iVar15 >> 2,iVar14 >> 2,(this->super_Padding).left,
                       (this->super_Padding).right,(__m128 *)local_180);
            return 0;
          }
          return -100;
        }
        break;
      case 3:
        uVar38 = uVar33 + _c * 4 + iVar14;
        sVar19 = ((uVar38 & 3) == 0) * '\x02';
        if ((uVar38 & 7) == 0) {
          sVar19 = 3;
        }
        if ((((uVar33 & 3) == 0) && ((uVar38 & 7) == 4)) &&
           ((uVar38 == _c * 4 || ((this->super_Padding).type == 0)))) {
          uVar38 = (int)uVar38 >> 2;
          local_100._0_8_ = uVar34;
          Mat::create(top_blob,uVar4 + uVar27 + iVar31,uVar25 + uVar32 + iVar16,uVar38,
                      (uVar34 >> 2) << sVar19,4,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            iVar14 = (this->super_Padding).front;
            iVar20 = iVar14 + 3;
            if (-1 < iVar14) {
              iVar20 = iVar14;
            }
            if ((int)uVar38 < 1) {
              return 0;
            }
            local_100._4_4_ = 0;
            local_100._0_4_ = uVar38;
            lVar18 = 0;
            do {
              OVar13 = _local_c0;
              afVar10 = _local_180;
              uVar34 = top_blob->elemsize;
              uVar17 = (long)top_blob->h * (long)top_blob->w;
              uVar37 = (uVar34 * uVar17 + 0xf & 0xfffffffffffffff0) / uVar34;
              if (top_blob->dims == 4) {
                uVar37 = uVar17;
              }
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                local_c0._0_4_ = (this->super_Padding).value;
                local_c0._4_4_ = local_c0._0_4_;
                uStack_b8._0_4_ = (float)local_c0._0_4_;
                uStack_b8._4_4_ = (float)local_c0._0_4_;
              }
              else {
                pfVar1 = (float *)((long)(this->super_Padding).per_channel_pad_data.data +
                                  lVar18 * 0x10);
                local_c0._0_4_ = *pfVar1;
                local_c0._4_4_ = pfVar1[1];
                uStack_b8._0_4_ = pfVar1[2];
                uStack_b8._4_4_ = pfVar1[3];
              }
              pMVar22 = (Mat *)(top_blob->cstep * lVar18 * uVar34 + (long)top_blob->data);
              auStack_b0 = OVar13._16_48_;
              uVar25 = (int)lVar18 - (iVar20 >> 2);
              if ((int)uVar25 < 0 || (int)_c <= (int)uVar25) {
                iVar14 = top_blob->d * (int)uVar37;
                if (0 < iVar14) {
                  do {
                    *(undefined4 *)&pMVar22->data = local_c0._0_4_;
                    *(undefined4 *)((long)&pMVar22->data + 4) = local_c0._4_4_;
                    *(float *)&pMVar22->refcount = (float)uStack_b8;
                    *(float *)((long)&pMVar22->refcount + 4) = uStack_b8._4_4_;
                    pMVar22 = (Mat *)&pMVar22->elemsize;
                    iVar14 = iVar14 + -1;
                  } while (iVar14 != 0);
                }
              }
              else {
                uVar34 = local_110->elemsize;
                uStack_178._0_4_ = 0.0;
                uStack_178._4_4_ = 0.0;
                local_180 = (undefined1  [8])
                            ((ulong)uVar25 * local_110->cstep * uVar34 + (long)local_110->data);
                uStack_170._0_4_ = (float)(int)uVar34;
                uStack_170._4_4_ = (float)(int)(uVar34 >> 0x20);
                _fStack_164 = afVar10._28_36_;
                fStack_168 = (float)local_110->elempack;
                afVar11 = _local_180;
                _iStack_158 = afVar10._40_24_;
                _local_180 = afVar11._0_32_;
                pAStack_160 = local_110->allocator;
                auVar9 = _local_180;
                fStack_154 = (float)local_110->w;
                fStack_150 = (float)local_110->h;
                uStack_14c._0_4_ = 1.4013e-45;
                fStack_144 = afVar10[0xf];
                uStack_14c._4_4_ = (float)local_110->d;
                uVar37 = (long)local_110->h * (long)local_110->w;
                iStack_158 = local_110->dims + -1;
                _local_180 = CONCAT440(iStack_158,auVar9);
                local_140 = (uVar34 * uVar37 + 0xf & 0xfffffffffffffff0) / uVar34;
                if (local_110->dims == 4) {
                  local_140 = uVar37;
                }
                iVar14 = (this->super_Padding).type;
                if (iVar14 == 0) {
                  padding_constant_pack4_sse
                            ((ncnn *)local_180,pMVar22,(Mat *)(ulong)(uint)top_blob->w,
                             (this->super_Padding).top,(this->super_Padding).bottom,
                             (this->super_Padding).left,(this->super_Padding).right,
                             (__m128 *)local_c0);
                  iVar14 = (this->super_Padding).type;
                }
                if (iVar14 == 1) {
                  padding_replicate_pack4_sse
                            ((Mat *)local_180,pMVar22,(this->super_Padding).top,
                             (this->super_Padding).bottom,(this->super_Padding).left,
                             (this->super_Padding).right);
                  iVar14 = (this->super_Padding).type;
                }
                if (iVar14 == 2) {
                  padding_reflect_pack4_sse
                            ((Mat *)local_180,pMVar22,(this->super_Padding).top,
                             (this->super_Padding).bottom,(this->super_Padding).left,
                             (this->super_Padding).right);
                }
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 != local_100._0_8_);
            return 0;
          }
          return -100;
        }
LAB_004071a6:
        local_100._0_8_ = uVar34;
        iVar15 = 3;
        break;
      case 4:
        iVar15 = 4;
        if ((this->super_Padding).type == 0) {
          uVar33 = uVar33 + iVar14 + iVar26;
          Mat::create(top_blob,uVar4 + uVar27 + iVar31,uVar25 + uVar32 + iVar16,uVar33,_c,uVar34,4,
                      opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if ((int)_c < 1) {
              return 0;
            }
            local_108 = (ulong)_c;
            uVar34 = 0;
            do {
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                fVar21 = (this->super_Padding).value;
                auVar40._4_4_ = fVar21;
                auVar40._0_4_ = fVar21;
                auVar40._8_4_ = fVar21;
                auVar40._12_4_ = fVar21;
              }
              else {
                auVar40 = *(undefined1 (*) [16])
                           ((long)(this->super_Padding).per_channel_pad_data.data + uVar34 * 0x10);
              }
              auVar39 = ZEXT1664(auVar40);
              local_c0[0] = (bool)auVar40[0];
              local_c0[1] = (bool)auVar40[1];
              local_c0[2] = (bool)auVar40[2];
              local_c0[3] = (bool)auVar40[3];
              local_c0._4_4_ = auVar40._4_4_;
              uStack_b8 = (Allocator *)auVar40._8_8_;
              if (0 < (int)uVar33) {
                uVar37 = 0;
                local_100._0_16_ = auVar40;
                do {
                  afVar10 = _local_180;
                  uVar17 = (long)top_blob->h * (long)top_blob->w;
                  pMVar22 = (Mat *)((long)top_blob->data +
                                   top_blob->elemsize * uVar37 * uVar17 +
                                   top_blob->cstep * uVar34 * top_blob->elemsize);
                  uVar25 = (int)uVar37 - (this->super_Padding).front;
                  if ((int)uVar25 < 0 || iVar26 <= (int)uVar25) {
                    if (0 < (int)uVar17) {
                      do {
                        pMVar22->data = (void *)SUB168(auVar39._0_16_,0);
                        pMVar22->refcount = (int *)SUB168(auVar39._0_16_,8);
                        pMVar22 = (Mat *)&pMVar22->elemsize;
                        uVar25 = (int)uVar17 - 1;
                        uVar17 = (ulong)uVar25;
                      } while (uVar25 != 0);
                    }
                  }
                  else {
                    sVar6 = local_110->elemsize;
                    local_140 = (long)local_110->h * (long)local_110->w;
                    uStack_178._0_4_ = 0.0;
                    uStack_178._4_4_ = 0.0;
                    local_180 = (undefined1  [8])
                                ((long)local_110->data +
                                uVar25 * sVar6 * local_140 + local_110->cstep * uVar34 * sVar6);
                    uStack_170._0_4_ = (float)(int)sVar6;
                    uStack_170._4_4_ = (float)(int)(sVar6 >> 0x20);
                    _fStack_164 = afVar10._28_36_;
                    fStack_168 = (float)local_110->elempack;
                    pAStack_160 = local_110->allocator;
                    iStack_158 = 2;
                    fStack_154 = (float)local_110->w;
                    fStack_150 = (float)local_110->h;
                    fStack_144 = afVar10[0xf];
                    uStack_14c._0_4_ = 1.4013e-45;
                    uStack_14c._4_4_ = 1.4013e-45;
                    padding_constant_pack4_sse
                              ((ncnn *)local_180,pMVar22,(Mat *)(long)top_blob->w,
                               (this->super_Padding).top,(this->super_Padding).bottom,
                               (this->super_Padding).left,(this->super_Padding).right,
                               (__m128 *)local_c0);
                    auVar39 = ZEXT1664(local_100._0_16_);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar33);
              }
              uVar34 = uVar34 + 1;
            } while (uVar34 != local_108);
            return 0;
          }
          return -100;
        }
      }
    }
    else if (iVar20 == 8) {
      switch(iVar15) {
      case 1:
        uVar27 = uVar4 + iVar31 * 8 + uVar27;
        iVar15 = 1;
        if (((uVar4 | uVar27) & 7) == 0 && (this->super_Padding).type == 0) {
          uVar25 = uVar27 + 7;
          if (-1 < (int)uVar27) {
            uVar25 = uVar27;
          }
          Mat::create(top_blob,(int)uVar25 >> 3,uVar34 & 0xfffffffffffffff8,8,opt->blob_allocator);
          if ((Mat *)top_blob->data != (Mat *)0x0) {
            if ((long)top_blob->c * top_blob->cstep != 0) {
              local_180._4_4_ = (this->super_Padding).value;
              local_180._0_4_ = local_180._4_4_;
              uStack_178._0_4_ = (float)local_180._4_4_;
              uStack_178._4_4_ = (float)local_180._4_4_;
              uStack_170._0_4_ = (float)local_180._4_4_;
              uStack_170._4_4_ = (float)local_180._4_4_;
              fStack_168 = (float)local_180._4_4_;
              fStack_164 = (float)local_180._4_4_;
              iVar14 = (this->super_Padding).left;
              iVar20 = iVar14 + 7;
              if (-1 < iVar14) {
                iVar20 = iVar14;
              }
              iVar14 = (this->super_Padding).right;
              iVar15 = iVar14 + 7;
              if (-1 < iVar14) {
                iVar15 = iVar14;
              }
              padding_constant_pack8_avx
                        ((ncnn *)local_110,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,0,0
                         ,iVar20 >> 3,iVar15 >> 3,(__m256 *)local_180);
              return 0;
            }
            return -100;
          }
          return -100;
        }
        break;
      case 2:
        uVar32 = uVar25 + iVar16 * 8 + uVar32;
        iVar15 = 2;
        if (((uVar25 | uVar32) & 7) == 0 && (this->super_Padding).type == 0) {
          uVar25 = uVar32 + 7;
          if (-1 < (int)uVar32) {
            uVar25 = uVar32;
          }
          Mat::create(top_blob,uVar4 + uVar27 + iVar31,(int)uVar25 >> 3,uVar34 & 0xfffffffffffffff8,
                      8,opt->blob_allocator);
          if ((Mat *)top_blob->data != (Mat *)0x0) {
            if ((long)top_blob->c * top_blob->cstep != 0) {
              local_180._4_4_ = (this->super_Padding).value;
              local_180._0_4_ = local_180._4_4_;
              uStack_178._0_4_ = (float)local_180._4_4_;
              uStack_178._4_4_ = (float)local_180._4_4_;
              uStack_170._0_4_ = (float)local_180._4_4_;
              uStack_170._4_4_ = (float)local_180._4_4_;
              fStack_168 = (float)local_180._4_4_;
              fStack_164 = (float)local_180._4_4_;
              iVar14 = (this->super_Padding).top;
              iVar20 = (this->super_Padding).bottom;
              iVar15 = iVar14 + 7;
              if (-1 < iVar14) {
                iVar15 = iVar14;
              }
              iVar14 = iVar20 + 7;
              if (-1 < iVar20) {
                iVar14 = iVar20;
              }
              padding_constant_pack8_avx
                        ((ncnn *)local_110,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,
                         iVar15 >> 3,iVar14 >> 3,(this->super_Padding).left,
                         (this->super_Padding).right,(__m256 *)local_180);
              return 0;
            }
            return -100;
          }
          return -100;
        }
        break;
      case 3:
        uVar38 = uVar33 + _c * 8 + iVar14;
        local_100._0_8_ = uVar34;
        sVar19 = ((uVar38 & 3) == 0) * '\x02';
        if ((uVar38 & 7) == 0) {
          sVar19 = 3;
        }
        if ((((uVar33 | uVar38) & 7) == 0) &&
           ((uVar38 == _c * 8 || ((this->super_Padding).type == 0)))) {
          uVar33 = uVar38 + 7;
          if (-1 < (int)uVar38) {
            uVar33 = uVar38;
          }
          Mat::create(top_blob,uVar4 + uVar27 + iVar31,uVar25 + uVar32 + iVar16,(int)uVar33 >> 3,
                      (uVar34 >> 3) << sVar19,8,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep == 0) {
            return -100;
          }
          iVar14 = (this->super_Padding).front;
          iVar20 = iVar14 + 7;
          if (-1 < iVar14) {
            iVar20 = iVar14;
          }
          if ((int)uVar38 < 8) {
            return 0;
          }
          local_108 = (ulong)(uint)((int)uVar33 >> 3);
          uVar34 = 0;
          do {
            afVar10 = _local_180;
            uVar37 = top_blob->elemsize;
            uVar23 = (long)top_blob->h * (long)top_blob->w;
            uVar17 = (uVar37 * uVar23 + 0xf & 0xfffffffffffffff0) / uVar37;
            if (top_blob->dims == 4) {
              uVar17 = uVar23;
            }
            if ((this->super_Padding).per_channel_pad_data_size == 0) {
              fVar21 = (this->super_Padding).value;
              auVar42._4_4_ = fVar21;
              auVar42._0_4_ = fVar21;
              auVar42._8_4_ = fVar21;
              auVar42._12_4_ = fVar21;
              auVar42._16_4_ = fVar21;
              auVar42._20_4_ = fVar21;
              auVar42._24_4_ = fVar21;
              auVar42._28_4_ = fVar21;
            }
            else {
              auVar42 = *(undefined1 (*) [32])
                         ((long)(this->super_Padding).per_channel_pad_data.data + uVar34 * 0x20);
            }
            pMVar22 = (Mat *)(top_blob->cstep * uVar34 * uVar37 + (long)top_blob->data);
            local_c0[0] = (bool)auVar42[0];
            local_c0[1] = (bool)auVar42[1];
            local_c0[2] = (bool)auVar42[2];
            local_c0[3] = (bool)auVar42[3];
            local_c0._4_4_ = auVar42._4_4_;
            uStack_b8 = (Allocator *)auVar42._8_8_;
            auStack_b0._0_8_ = auVar42._16_8_;
            auStack_b0._8_4_ = auVar42._24_4_;
            auStack_b0[0xc] = (bool)auVar42[0x1c];
            auStack_b0[0xd] = (bool)auVar42[0x1d];
            auStack_b0[0xe] = (bool)auVar42[0x1e];
            auStack_b0[0xf] = (bool)auVar42[0x1f];
            uVar25 = (int)uVar34 - (iVar20 >> 3);
            if ((int)uVar25 < 0 || (int)_c <= (int)uVar25) {
              iVar14 = top_blob->d * (int)uVar17;
              if (0 < iVar14) {
                do {
                  pMVar22->data = (void *)auVar42._0_8_;
                  pMVar22->refcount = (int *)auVar42._8_8_;
                  pMVar22->elemsize = auVar42._16_8_;
                  pMVar22->elempack = auVar42._24_4_;
                  *(int *)&pMVar22->field_0x1c = auVar42._28_4_;
                  pMVar22 = (Mat *)&pMVar22->allocator;
                  iVar14 = iVar14 + -1;
                } while (iVar14 != 0);
              }
            }
            else {
              fVar21 = (float)local_110->h;
              uVar37 = local_110->elemsize;
              pauVar35 = (undefined1 (*) [32])
                         ((ulong)uVar25 * local_110->cstep * uVar37 + (long)local_110->data);
              uStack_178._0_4_ = 0.0;
              uStack_178._4_4_ = 0.0;
              local_180 = (undefined1  [8])pauVar35;
              uStack_170._0_4_ = (float)(int)uVar37;
              uStack_170._4_4_ = (float)(int)(uVar37 >> 0x20);
              _fStack_164 = afVar10._28_36_;
              fStack_168 = (float)local_110->elempack;
              afVar11 = _local_180;
              _iStack_158 = afVar10._40_24_;
              _local_180 = afVar11._0_32_;
              pAStack_160 = local_110->allocator;
              auVar9 = _local_180;
              fStack_154 = (float)local_110->w;
              fStack_150 = fVar21;
              uStack_14c._0_4_ = 1.4013e-45;
              fStack_144 = afVar10[0xf];
              uStack_14c._4_4_ = (float)local_110->d;
              uVar17 = (long)(int)fVar21 * (long)local_110->w;
              iStack_158 = local_110->dims + -1;
              _local_180 = CONCAT440(iStack_158,auVar9);
              local_140 = (uVar37 * uVar17 + 0xf & 0xfffffffffffffff0) / uVar37;
              if (local_110->dims == 4) {
                local_140 = uVar17;
              }
              iVar14 = (this->super_Padding).type;
              if (iVar14 == 0) {
                padding_constant_pack8_avx
                          ((ncnn *)local_180,pMVar22,(Mat *)(ulong)(uint)top_blob->w,
                           (this->super_Padding).top,(this->super_Padding).bottom,
                           (this->super_Padding).left,(this->super_Padding).right,(__m256 *)local_c0
                          );
                iVar14 = (this->super_Padding).type;
              }
              if (iVar14 == 1) {
                iVar14 = (this->super_Padding).top;
                iVar15 = (this->super_Padding).bottom;
                iVar31 = (this->super_Padding).left;
                iVar16 = (this->super_Padding).right;
                pMVar24 = pMVar22;
                if (0 < iVar14) {
                  iVar26 = 0;
                  do {
                    auVar41 = *pauVar35;
                    iVar28 = iVar31;
                    if (0 < iVar31) {
                      do {
                        pMVar24->data = (void *)auVar41._0_8_;
                        pMVar24->refcount = (int *)auVar41._8_8_;
                        pMVar24->elemsize = auVar41._16_8_;
                        pMVar24->elempack = auVar41._24_4_;
                        *(int *)&pMVar24->field_0x1c = auVar41._28_4_;
                        pMVar24 = (Mat *)&pMVar24->allocator;
                        iVar28 = iVar28 + -1;
                      } while (iVar28 != 0);
                    }
                    if (0 < (int)fStack_154) {
                      iVar28 = 0;
                      pauVar29 = pauVar35;
                      do {
                        auVar41 = *pauVar29;
                        pMVar24->data = (void *)auVar41._0_8_;
                        pMVar24->refcount = (int *)auVar41._8_8_;
                        pMVar24->elemsize = auVar41._16_8_;
                        pMVar24->elempack = auVar41._24_4_;
                        *(int *)&pMVar24->field_0x1c = auVar41._28_4_;
                        pauVar29 = pauVar29 + 1;
                        pMVar24 = (Mat *)&pMVar24->allocator;
                        iVar28 = iVar28 + 1;
                      } while (iVar28 < (int)fStack_154);
                    }
                    iVar28 = iVar16;
                    if (0 < iVar16) {
                      do {
                        pMVar24->data = (void *)auVar41._0_8_;
                        pMVar24->refcount = (int *)auVar41._8_8_;
                        pMVar24->elemsize = auVar41._16_8_;
                        pMVar24->elempack = auVar41._24_4_;
                        *(int *)&pMVar24->field_0x1c = auVar41._28_4_;
                        pMVar24 = (Mat *)&pMVar24->allocator;
                        iVar28 = iVar28 + -1;
                      } while (iVar28 != 0);
                    }
                    iVar26 = iVar26 + 1;
                    fVar21 = fStack_150;
                  } while (iVar26 != iVar14);
                }
                if (0 < (int)fVar21) {
                  iVar14 = 0;
                  do {
                    auVar41 = *pauVar35;
                    iVar26 = iVar31;
                    if (0 < iVar31) {
                      do {
                        pMVar24->data = (void *)auVar41._0_8_;
                        pMVar24->refcount = (int *)auVar41._8_8_;
                        pMVar24->elemsize = auVar41._16_8_;
                        pMVar24->elempack = auVar41._24_4_;
                        *(int *)&pMVar24->field_0x1c = auVar41._28_4_;
                        pMVar24 = (Mat *)&pMVar24->allocator;
                        iVar26 = iVar26 + -1;
                      } while (iVar26 != 0);
                    }
                    if (0 < (int)fStack_154) {
                      iVar26 = 0;
                      do {
                        auVar41 = *pauVar35;
                        pMVar24->data = (void *)auVar41._0_8_;
                        pMVar24->refcount = (int *)auVar41._8_8_;
                        pMVar24->elemsize = auVar41._16_8_;
                        pMVar24->elempack = auVar41._24_4_;
                        *(int *)&pMVar24->field_0x1c = auVar41._28_4_;
                        pauVar35 = pauVar35 + 1;
                        pMVar24 = (Mat *)&pMVar24->allocator;
                        iVar26 = iVar26 + 1;
                      } while (iVar26 < (int)fStack_154);
                    }
                    iVar26 = iVar16;
                    if (0 < iVar16) {
                      do {
                        pMVar24->data = (void *)auVar41._0_8_;
                        pMVar24->refcount = (int *)auVar41._8_8_;
                        pMVar24->elemsize = auVar41._16_8_;
                        pMVar24->elempack = auVar41._24_4_;
                        *(int *)&pMVar24->field_0x1c = auVar41._28_4_;
                        pMVar24 = (Mat *)&pMVar24->allocator;
                        iVar26 = iVar26 + -1;
                      } while (iVar26 != 0);
                    }
                    iVar14 = iVar14 + 1;
                  } while (iVar14 < (int)fStack_150);
                }
                if (0 < iVar15) {
                  iVar14 = 0;
                  do {
                    auVar41 = pauVar35[-(long)(int)fStack_154];
                    iVar26 = iVar31;
                    if (0 < iVar31) {
                      do {
                        pMVar24->data = (void *)auVar41._0_8_;
                        pMVar24->refcount = (int *)auVar41._8_8_;
                        pMVar24->elemsize = auVar41._16_8_;
                        pMVar24->elempack = auVar41._24_4_;
                        *(int *)&pMVar24->field_0x1c = auVar41._28_4_;
                        pMVar24 = (Mat *)&pMVar24->allocator;
                        iVar26 = iVar26 + -1;
                      } while (iVar26 != 0);
                    }
                    if (0 < (int)fStack_154) {
                      iVar26 = 0;
                      pauVar29 = pauVar35 + -(long)(int)fStack_154;
                      do {
                        auVar41 = *pauVar29;
                        pMVar24->data = (void *)auVar41._0_8_;
                        pMVar24->refcount = (int *)auVar41._8_8_;
                        pMVar24->elemsize = auVar41._16_8_;
                        pMVar24->elempack = auVar41._24_4_;
                        *(int *)&pMVar24->field_0x1c = auVar41._28_4_;
                        pauVar29 = pauVar29 + 1;
                        pMVar24 = (Mat *)&pMVar24->allocator;
                        iVar26 = iVar26 + 1;
                      } while (iVar26 < (int)fStack_154);
                    }
                    iVar26 = iVar16;
                    if (0 < iVar16) {
                      do {
                        pMVar24->data = (void *)auVar41._0_8_;
                        pMVar24->refcount = (int *)auVar41._8_8_;
                        pMVar24->elemsize = auVar41._16_8_;
                        pMVar24->elempack = auVar41._24_4_;
                        *(int *)&pMVar24->field_0x1c = auVar41._28_4_;
                        pMVar24 = (Mat *)&pMVar24->allocator;
                        iVar26 = iVar26 + -1;
                      } while (iVar26 != 0);
                    }
                    iVar14 = iVar14 + 1;
                  } while (iVar14 != iVar15);
                }
              }
              if ((this->super_Padding).type == 2) {
                iVar14 = (this->super_Padding).top;
                iVar15 = (this->super_Padding).bottom;
                local_100._0_4_ = iVar15;
                uVar25 = (this->super_Padding).left;
                uVar37 = (ulong)uVar25;
                uVar32 = (this->super_Padding).right;
                uVar17 = (ulong)uVar32;
                pauVar35 = (undefined1 (*) [32])
                           ((long)(iVar14 * (int)fStack_154 * 8) * 4 + (long)local_180);
                if (0 < iVar14) {
                  iVar31 = 0;
                  do {
                    lVar18 = uVar37 << 5;
                    if (0 < (int)uVar25) {
                      do {
                        *(undefined1 (*) [32])pMVar22 = *(undefined1 (*) [32])(*pauVar35 + lVar18);
                        pMVar22 = (Mat *)&pMVar22->allocator;
                        lVar18 = lVar18 + -0x20;
                      } while (lVar18 != 0);
                    }
                    pauVar29 = pauVar35;
                    if (0 < (int)fStack_154) {
                      iVar16 = 0;
                      do {
                        *(undefined1 (*) [32])pMVar22 = *pauVar29;
                        pauVar29 = pauVar29 + 1;
                        pMVar22 = (Mat *)&pMVar22->allocator;
                        iVar16 = iVar16 + 1;
                      } while (iVar16 < (int)fStack_154);
                    }
                    if (0 < (int)uVar32) {
                      lVar18 = -0x40;
                      do {
                        *(undefined1 (*) [32])pMVar22 = *(undefined1 (*) [32])(*pauVar29 + lVar18);
                        pMVar22 = (Mat *)&pMVar22->allocator;
                        lVar2 = uVar17 * 0x20 + lVar18;
                        lVar18 = lVar18 + -0x20;
                      } while (lVar2 != -0x20);
                    }
                    pauVar35 = (undefined1 (*) [32])
                               ((long)pauVar35 + (long)((int)fStack_154 * 8) * -4);
                    iVar31 = iVar31 + 1;
                  } while (iVar31 != iVar14);
                }
                if (0 < (int)fStack_150) {
                  iVar14 = 0;
                  do {
                    lVar18 = uVar37 << 5;
                    if (0 < (int)uVar25) {
                      do {
                        *(undefined1 (*) [32])pMVar22 = *(undefined1 (*) [32])(*pauVar35 + lVar18);
                        pMVar22 = (Mat *)&pMVar22->allocator;
                        lVar18 = lVar18 + -0x20;
                      } while (lVar18 != 0);
                    }
                    if (0 < (int)fStack_154) {
                      iVar31 = 0;
                      do {
                        *(undefined1 (*) [32])pMVar22 = *pauVar35;
                        pauVar35 = pauVar35 + 1;
                        pMVar22 = (Mat *)&pMVar22->allocator;
                        iVar31 = iVar31 + 1;
                      } while (iVar31 < (int)fStack_154);
                    }
                    if (0 < (int)uVar32) {
                      lVar18 = -0x40;
                      do {
                        *(undefined1 (*) [32])pMVar22 = *(undefined1 (*) [32])(*pauVar35 + lVar18);
                        pMVar22 = (Mat *)&pMVar22->allocator;
                        lVar2 = uVar17 * 0x20 + lVar18;
                        lVar18 = lVar18 + -0x20;
                      } while (lVar2 != -0x20);
                    }
                    iVar14 = iVar14 + 1;
                  } while (iVar14 < (int)fStack_150);
                }
                if (0 < iVar15) {
                  uVar23 = (ulong)(int)fStack_154;
                  pauVar35 = pauVar35 + uVar23 * -2;
                  iVar14 = 0;
                  do {
                    lVar18 = uVar37 << 5;
                    if (0 < (int)uVar25) {
                      do {
                        *(undefined1 (*) [32])pMVar22 = *(undefined1 (*) [32])(*pauVar35 + lVar18);
                        pMVar22 = (Mat *)&pMVar22->allocator;
                        lVar18 = lVar18 + -0x20;
                      } while (lVar18 != 0);
                      uVar23 = (ulong)(uint)fStack_154;
                    }
                    pauVar29 = pauVar35;
                    if (0 < (int)uVar23) {
                      iVar31 = 0;
                      do {
                        *(undefined1 (*) [32])pMVar22 = *pauVar29;
                        pauVar29 = pauVar29 + 1;
                        pMVar22 = (Mat *)&pMVar22->allocator;
                        iVar31 = iVar31 + 1;
                        uVar23 = (ulong)(uint)fStack_154;
                      } while (iVar31 < (int)fStack_154);
                    }
                    if (0 < (int)uVar32) {
                      lVar18 = -0x40;
                      do {
                        *(undefined1 (*) [32])pMVar22 = *(undefined1 (*) [32])(*pauVar29 + lVar18);
                        pMVar22 = (Mat *)&pMVar22->allocator;
                        lVar2 = uVar17 * 0x20 + lVar18;
                        lVar18 = lVar18 + -0x20;
                      } while (lVar2 != -0x20);
                      uVar23 = (ulong)(uint)fStack_154;
                    }
                    pauVar35 = (undefined1 (*) [32])((long)pauVar35 + (long)((int)uVar23 * 8) * -4);
                    iVar14 = iVar14 + 1;
                  } while (iVar14 != iVar15);
                }
              }
              if (uStack_178 != (int *)0x0) {
                LOCK();
                *uStack_178 = *uStack_178 + -1;
                UNLOCK();
                if (*uStack_178 == 0) {
                  if (pAStack_160 == (Allocator *)0x0) {
                    if (local_180 != (undefined1  [8])0x0) {
                      free((void *)local_180);
                    }
                  }
                  else {
                    (*pAStack_160->_vptr_Allocator[3])();
                  }
                }
              }
            }
            uVar34 = uVar34 + 1;
          } while (uVar34 != local_108);
          return 0;
        }
        goto LAB_004071a6;
      case 4:
        iVar15 = 4;
        if ((this->super_Padding).type == 0) {
          uVar33 = uVar33 + iVar14 + iVar26;
          Mat::create(top_blob,uVar4 + uVar27 + iVar31,uVar25 + uVar32 + iVar16,uVar33,_c,uVar34,8,
                      opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if ((int)_c < 1) {
              return 0;
            }
            local_108 = (ulong)_c;
            uVar34 = 0;
            do {
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                fVar21 = (this->super_Padding).value;
                auVar41._4_4_ = fVar21;
                auVar41._0_4_ = fVar21;
                auVar41._8_4_ = fVar21;
                auVar41._12_4_ = fVar21;
                auVar41._16_4_ = fVar21;
                auVar41._20_4_ = fVar21;
                auVar41._24_4_ = fVar21;
                auVar41._28_4_ = fVar21;
              }
              else {
                auVar41 = *(undefined1 (*) [32])
                           ((long)(this->super_Padding).per_channel_pad_data.data + uVar34 * 0x20);
              }
              auVar39 = ZEXT3264(auVar41);
              local_c0[0] = (bool)auVar41[0];
              local_c0[1] = (bool)auVar41[1];
              local_c0[2] = (bool)auVar41[2];
              local_c0[3] = (bool)auVar41[3];
              local_c0._4_4_ = auVar41._4_4_;
              uStack_b8 = (Allocator *)auVar41._8_8_;
              auStack_b0._0_8_ = auVar41._16_8_;
              auStack_b0._8_4_ = auVar41._24_4_;
              auStack_b0[0xc] = (bool)auVar41[0x1c];
              auStack_b0[0xd] = (bool)auVar41[0x1d];
              auStack_b0[0xe] = (bool)auVar41[0x1e];
              auStack_b0[0xf] = (bool)auVar41[0x1f];
              if (0 < (int)uVar33) {
                uVar37 = 0;
                local_100._0_32_ = auVar41;
                do {
                  afVar10 = _local_180;
                  uVar17 = (long)top_blob->h * (long)top_blob->w;
                  pMVar22 = (Mat *)((long)top_blob->data +
                                   top_blob->elemsize * uVar37 * uVar17 +
                                   top_blob->cstep * uVar34 * top_blob->elemsize);
                  uVar25 = (int)uVar37 - (this->super_Padding).front;
                  if ((int)uVar25 < 0 || iVar26 <= (int)uVar25) {
                    if (0 < (int)uVar17) {
                      do {
                        auVar41 = auVar39._0_32_;
                        pMVar22->data = (void *)auVar41._0_8_;
                        pMVar22->refcount = (int *)auVar41._8_8_;
                        pMVar22->elemsize = auVar41._16_8_;
                        pMVar22->elempack = auVar41._24_4_;
                        *(int *)&pMVar22->field_0x1c = auVar41._28_4_;
                        pMVar22 = (Mat *)&pMVar22->allocator;
                        uVar25 = (int)uVar17 - 1;
                        uVar17 = (ulong)uVar25;
                      } while (uVar25 != 0);
                    }
                  }
                  else {
                    sVar6 = local_110->elemsize;
                    local_140 = (long)local_110->h * (long)local_110->w;
                    uStack_178._0_4_ = 0.0;
                    uStack_178._4_4_ = 0.0;
                    local_180 = (undefined1  [8])
                                ((long)local_110->data +
                                uVar25 * sVar6 * local_140 + local_110->cstep * uVar34 * sVar6);
                    uStack_170._0_4_ = (float)(int)sVar6;
                    uStack_170._4_4_ = (float)(int)(sVar6 >> 0x20);
                    _fStack_164 = afVar10._28_36_;
                    fStack_168 = (float)local_110->elempack;
                    pAStack_160 = local_110->allocator;
                    iStack_158 = 2;
                    fStack_154 = (float)local_110->w;
                    fStack_150 = (float)local_110->h;
                    fStack_144 = afVar10[0xf];
                    uStack_14c._0_4_ = 1.4013e-45;
                    uStack_14c._4_4_ = 1.4013e-45;
                    padding_constant_pack8_avx
                              ((ncnn *)local_180,pMVar22,(Mat *)(long)top_blob->w,
                               (this->super_Padding).top,(this->super_Padding).bottom,
                               (this->super_Padding).left,(this->super_Padding).right,
                               (__m256 *)local_c0);
                    auVar39 = ZEXT3264(local_100._0_32_);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar33);
              }
              uVar34 = uVar34 + 1;
            } while (uVar34 != local_108);
            return 0;
          }
          return -100;
        }
      }
    }
    else if (iVar20 == 0x10) {
      switch(iVar15) {
      case 1:
        uVar27 = uVar27 + uVar4;
        iVar15 = 1;
        if (((uVar4 | uVar27) & 0xf) == 0 && (this->super_Padding).type == 0) {
          iVar20 = uVar27 + iVar31 * 0x10;
          iVar14 = uVar27 + iVar31 * 0x10 + 0xf;
          if (-1 < iVar20) {
            iVar14 = iVar20;
          }
          Mat::create(top_blob,iVar14 >> 4,uVar34 & 0xfffffffffffffff0,0x10,opt->blob_allocator);
          if ((Mat *)top_blob->data != (Mat *)0x0) {
            if ((long)top_blob->c * top_blob->cstep != 0) {
              auVar39 = vpbroadcastd_avx512f(ZEXT416((uint)(this->super_Padding).value));
              _local_180 = (__m512)vmovdqa64_avx512f(auVar39);
              iVar14 = (this->super_Padding).left;
              iVar20 = iVar14 + 0xf;
              if (-1 < iVar14) {
                iVar20 = iVar14;
              }
              iVar14 = (this->super_Padding).right;
              iVar15 = iVar14 + 0xf;
              if (-1 < iVar14) {
                iVar15 = iVar14;
              }
              padding_constant_pack16_avx512
                        ((ncnn *)local_110,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,0,0
                         ,iVar20 >> 4,iVar15 >> 4,(__m512 *)local_180);
              return 0;
            }
            return -100;
          }
          return -100;
        }
        break;
      case 2:
        uVar32 = uVar32 + uVar25 + iVar16 * 0x10;
        iVar15 = 2;
        if (((uVar25 | uVar32) & 0xf) == 0 && (this->super_Padding).type == 0) {
          uVar25 = uVar32 + 0xf;
          if (-1 < (int)uVar32) {
            uVar25 = uVar32;
          }
          Mat::create(top_blob,uVar4 + uVar27 + iVar31,(int)uVar25 >> 4,uVar34 & 0xfffffffffffffff0,
                      0x10,opt->blob_allocator);
          if ((Mat *)top_blob->data != (Mat *)0x0) {
            if ((long)top_blob->c * top_blob->cstep != 0) {
              auVar39 = vpbroadcastd_avx512f(ZEXT416((uint)(this->super_Padding).value));
              _local_180 = (__m512)vmovdqa64_avx512f(auVar39);
              iVar14 = (this->super_Padding).top;
              iVar20 = (this->super_Padding).bottom;
              iVar15 = iVar14 + 0xf;
              if (-1 < iVar14) {
                iVar15 = iVar14;
              }
              iVar14 = iVar20 + 0xf;
              if (-1 < iVar20) {
                iVar14 = iVar20;
              }
              padding_constant_pack16_avx512
                        ((ncnn *)local_110,(Mat *)top_blob->data,(Mat *)(ulong)(uint)top_blob->w,
                         iVar15 >> 4,iVar14 >> 4,(this->super_Padding).left,
                         (this->super_Padding).right,(__m512 *)local_180);
              return 0;
            }
            return -100;
          }
          return -100;
        }
        break;
      case 3:
        local_100._0_8_ = uVar34;
        uVar38 = uVar33 + iVar14 + _c * 0x10;
        if ((((uVar38 & 0xf) == 0) && ((uVar33 & 0xf) == 0)) &&
           ((uVar38 == _c * 0x10 || ((this->super_Padding).type == 0)))) {
          uVar38 = (int)uVar38 >> 4;
          Mat::create(top_blob,uVar4 + uVar27 + iVar31,uVar25 + uVar32 + iVar16,uVar38,
                      uVar34 & 0xfffffffffffffff0,0x10,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            iVar14 = (this->super_Padding).front;
            iVar20 = iVar14 + 0xf;
            if (-1 < iVar14) {
              iVar20 = iVar14;
            }
            if ((int)uVar38 < 1) {
              return 0;
            }
            local_108 = (ulong)uVar38;
            uVar34 = 0;
            do {
              afVar10 = _local_180;
              uVar37 = top_blob->elemsize;
              uVar23 = (long)top_blob->h * (long)top_blob->w;
              uVar17 = (uVar37 * uVar23 + 0xf & 0xfffffffffffffff0) / uVar37;
              if (top_blob->dims == 4) {
                uVar17 = uVar23;
              }
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                auVar39 = vpbroadcastd_avx512f(ZEXT416((uint)(this->super_Padding).value));
              }
              else {
                auVar39 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                             ((long)(this->super_Padding).per_channel_pad_data.data
                                             + uVar34 * 0x40));
              }
              pMVar22 = (Mat *)(top_blob->cstep * uVar34 * uVar37 + (long)top_blob->data);
              _local_c0 = (Option)vmovdqa64_avx512f(auVar39);
              uVar25 = (int)uVar34 - (iVar20 >> 4);
              if ((int)uVar25 < 0 || (int)_c <= (int)uVar25) {
                iVar14 = top_blob->d * (int)uVar17;
                if (0 < iVar14) {
                  do {
                    auVar3 = vmovdqu64_avx512f(auVar39);
                    pMVar22->data = (void *)auVar3._0_8_;
                    pMVar22->refcount = (int *)auVar3._8_8_;
                    pMVar22->elemsize = auVar3._16_8_;
                    pMVar22->elempack = auVar3._24_4_;
                    *(int *)&pMVar22->field_0x1c = auVar3._28_4_;
                    pMVar22->allocator = (Allocator *)auVar3._32_8_;
                    pMVar22->dims = auVar3._40_4_;
                    pMVar22->w = auVar3._44_4_;
                    pMVar22->h = auVar3._48_4_;
                    pMVar22->d = auVar3._52_4_;
                    pMVar22->c = auVar3._56_4_;
                    *(int *)&pMVar22->field_0x3c = auVar3._60_4_;
                    pMVar22 = (Mat *)&pMVar22->cstep;
                    iVar14 = iVar14 + -1;
                  } while (iVar14 != 0);
                }
              }
              else {
                fVar21 = (float)local_110->h;
                uVar37 = local_110->elemsize;
                pauVar36 = (undefined1 (*) [64])
                           ((ulong)uVar25 * local_110->cstep * uVar37 + (long)local_110->data);
                uStack_178._0_4_ = 0.0;
                uStack_178._4_4_ = 0.0;
                local_180 = (undefined1  [8])pauVar36;
                uStack_170._0_4_ = (float)(int)uVar37;
                uStack_170._4_4_ = (float)(int)(uVar37 >> 0x20);
                _fStack_164 = afVar10._28_36_;
                fStack_168 = (float)local_110->elempack;
                afVar11 = _local_180;
                _iStack_158 = afVar10._40_24_;
                _local_180 = afVar11._0_32_;
                pAStack_160 = local_110->allocator;
                auVar9 = _local_180;
                fStack_154 = (float)local_110->w;
                fStack_150 = fVar21;
                uStack_14c._0_4_ = 1.4013e-45;
                fStack_144 = afVar10[0xf];
                uStack_14c._4_4_ = (float)local_110->d;
                uVar17 = (long)(int)fVar21 * (long)local_110->w;
                iStack_158 = local_110->dims + -1;
                _local_180 = CONCAT440(iStack_158,auVar9);
                local_140 = (uVar37 * uVar17 + 0xf & 0xfffffffffffffff0) / uVar37;
                if (local_110->dims == 4) {
                  local_140 = uVar17;
                }
                iVar14 = (this->super_Padding).type;
                if (iVar14 == 0) {
                  padding_constant_pack16_avx512
                            ((ncnn *)local_180,pMVar22,(Mat *)(ulong)(uint)top_blob->w,
                             (this->super_Padding).top,(this->super_Padding).bottom,
                             (this->super_Padding).left,(this->super_Padding).right,
                             (__m512 *)local_c0);
                  iVar14 = (this->super_Padding).type;
                }
                if (iVar14 == 1) {
                  iVar14 = (this->super_Padding).top;
                  iVar15 = (this->super_Padding).bottom;
                  iVar31 = (this->super_Padding).left;
                  iVar16 = (this->super_Padding).right;
                  pMVar24 = pMVar22;
                  if (0 < iVar14) {
                    iVar26 = 0;
                    do {
                      auVar39 = vmovdqa64_avx512f(*pauVar36);
                      iVar28 = iVar31;
                      if (0 < iVar31) {
                        do {
                          auVar3 = vmovdqa64_avx512f(auVar39);
                          pMVar24->data = (void *)auVar3._0_8_;
                          pMVar24->refcount = (int *)auVar3._8_8_;
                          pMVar24->elemsize = auVar3._16_8_;
                          pMVar24->elempack = auVar3._24_4_;
                          *(int *)&pMVar24->field_0x1c = auVar3._28_4_;
                          pMVar24->allocator = (Allocator *)auVar3._32_8_;
                          pMVar24->dims = auVar3._40_4_;
                          pMVar24->w = auVar3._44_4_;
                          pMVar24->h = auVar3._48_4_;
                          pMVar24->d = auVar3._52_4_;
                          pMVar24->c = auVar3._56_4_;
                          *(int *)&pMVar24->field_0x3c = auVar3._60_4_;
                          pMVar24 = (Mat *)&pMVar24->cstep;
                          iVar28 = iVar28 + -1;
                        } while (iVar28 != 0);
                      }
                      if (0 < (int)fStack_154) {
                        iVar28 = 0;
                        pauVar30 = pauVar36;
                        do {
                          auVar39 = vmovdqa64_avx512f(*pauVar30);
                          auVar3 = vmovdqa64_avx512f(auVar39);
                          pMVar24->data = (void *)auVar3._0_8_;
                          pMVar24->refcount = (int *)auVar3._8_8_;
                          pMVar24->elemsize = auVar3._16_8_;
                          pMVar24->elempack = auVar3._24_4_;
                          *(int *)&pMVar24->field_0x1c = auVar3._28_4_;
                          pMVar24->allocator = (Allocator *)auVar3._32_8_;
                          pMVar24->dims = auVar3._40_4_;
                          pMVar24->w = auVar3._44_4_;
                          pMVar24->h = auVar3._48_4_;
                          pMVar24->d = auVar3._52_4_;
                          pMVar24->c = auVar3._56_4_;
                          *(int *)&pMVar24->field_0x3c = auVar3._60_4_;
                          pauVar30 = pauVar30 + 1;
                          pMVar24 = (Mat *)&pMVar24->cstep;
                          iVar28 = iVar28 + 1;
                        } while (iVar28 < (int)fStack_154);
                      }
                      iVar28 = iVar16;
                      if (0 < iVar16) {
                        do {
                          auVar3 = vmovdqa64_avx512f(auVar39);
                          pMVar24->data = (void *)auVar3._0_8_;
                          pMVar24->refcount = (int *)auVar3._8_8_;
                          pMVar24->elemsize = auVar3._16_8_;
                          pMVar24->elempack = auVar3._24_4_;
                          *(int *)&pMVar24->field_0x1c = auVar3._28_4_;
                          pMVar24->allocator = (Allocator *)auVar3._32_8_;
                          pMVar24->dims = auVar3._40_4_;
                          pMVar24->w = auVar3._44_4_;
                          pMVar24->h = auVar3._48_4_;
                          pMVar24->d = auVar3._52_4_;
                          pMVar24->c = auVar3._56_4_;
                          *(int *)&pMVar24->field_0x3c = auVar3._60_4_;
                          pMVar24 = (Mat *)&pMVar24->cstep;
                          iVar28 = iVar28 + -1;
                        } while (iVar28 != 0);
                      }
                      iVar26 = iVar26 + 1;
                      fVar21 = fStack_150;
                    } while (iVar26 != iVar14);
                  }
                  if (0 < (int)fVar21) {
                    iVar14 = 0;
                    do {
                      auVar39 = vmovdqa64_avx512f(*pauVar36);
                      iVar26 = iVar31;
                      if (0 < iVar31) {
                        do {
                          auVar3 = vmovdqa64_avx512f(auVar39);
                          pMVar24->data = (void *)auVar3._0_8_;
                          pMVar24->refcount = (int *)auVar3._8_8_;
                          pMVar24->elemsize = auVar3._16_8_;
                          pMVar24->elempack = auVar3._24_4_;
                          *(int *)&pMVar24->field_0x1c = auVar3._28_4_;
                          pMVar24->allocator = (Allocator *)auVar3._32_8_;
                          pMVar24->dims = auVar3._40_4_;
                          pMVar24->w = auVar3._44_4_;
                          pMVar24->h = auVar3._48_4_;
                          pMVar24->d = auVar3._52_4_;
                          pMVar24->c = auVar3._56_4_;
                          *(int *)&pMVar24->field_0x3c = auVar3._60_4_;
                          pMVar24 = (Mat *)&pMVar24->cstep;
                          iVar26 = iVar26 + -1;
                        } while (iVar26 != 0);
                      }
                      if (0 < (int)fStack_154) {
                        iVar26 = 0;
                        do {
                          auVar39 = vmovdqa64_avx512f(*pauVar36);
                          auVar3 = vmovdqa64_avx512f(auVar39);
                          pMVar24->data = (void *)auVar3._0_8_;
                          pMVar24->refcount = (int *)auVar3._8_8_;
                          pMVar24->elemsize = auVar3._16_8_;
                          pMVar24->elempack = auVar3._24_4_;
                          *(int *)&pMVar24->field_0x1c = auVar3._28_4_;
                          pMVar24->allocator = (Allocator *)auVar3._32_8_;
                          pMVar24->dims = auVar3._40_4_;
                          pMVar24->w = auVar3._44_4_;
                          pMVar24->h = auVar3._48_4_;
                          pMVar24->d = auVar3._52_4_;
                          pMVar24->c = auVar3._56_4_;
                          *(int *)&pMVar24->field_0x3c = auVar3._60_4_;
                          pauVar36 = pauVar36 + 1;
                          pMVar24 = (Mat *)&pMVar24->cstep;
                          iVar26 = iVar26 + 1;
                        } while (iVar26 < (int)fStack_154);
                      }
                      iVar26 = iVar16;
                      if (0 < iVar16) {
                        do {
                          auVar3 = vmovdqa64_avx512f(auVar39);
                          pMVar24->data = (void *)auVar3._0_8_;
                          pMVar24->refcount = (int *)auVar3._8_8_;
                          pMVar24->elemsize = auVar3._16_8_;
                          pMVar24->elempack = auVar3._24_4_;
                          *(int *)&pMVar24->field_0x1c = auVar3._28_4_;
                          pMVar24->allocator = (Allocator *)auVar3._32_8_;
                          pMVar24->dims = auVar3._40_4_;
                          pMVar24->w = auVar3._44_4_;
                          pMVar24->h = auVar3._48_4_;
                          pMVar24->d = auVar3._52_4_;
                          pMVar24->c = auVar3._56_4_;
                          *(int *)&pMVar24->field_0x3c = auVar3._60_4_;
                          pMVar24 = (Mat *)&pMVar24->cstep;
                          iVar26 = iVar26 + -1;
                        } while (iVar26 != 0);
                      }
                      iVar14 = iVar14 + 1;
                    } while (iVar14 < (int)fStack_150);
                  }
                  if (0 < iVar15) {
                    iVar14 = 0;
                    do {
                      auVar39 = vmovdqa64_avx512f(pauVar36[-(long)(int)fStack_154]);
                      iVar26 = iVar31;
                      if (0 < iVar31) {
                        do {
                          auVar3 = vmovdqa64_avx512f(auVar39);
                          pMVar24->data = (void *)auVar3._0_8_;
                          pMVar24->refcount = (int *)auVar3._8_8_;
                          pMVar24->elemsize = auVar3._16_8_;
                          pMVar24->elempack = auVar3._24_4_;
                          *(int *)&pMVar24->field_0x1c = auVar3._28_4_;
                          pMVar24->allocator = (Allocator *)auVar3._32_8_;
                          pMVar24->dims = auVar3._40_4_;
                          pMVar24->w = auVar3._44_4_;
                          pMVar24->h = auVar3._48_4_;
                          pMVar24->d = auVar3._52_4_;
                          pMVar24->c = auVar3._56_4_;
                          *(int *)&pMVar24->field_0x3c = auVar3._60_4_;
                          pMVar24 = (Mat *)&pMVar24->cstep;
                          iVar26 = iVar26 + -1;
                        } while (iVar26 != 0);
                      }
                      if (0 < (int)fStack_154) {
                        iVar26 = 0;
                        pauVar30 = pauVar36 + -(long)(int)fStack_154;
                        do {
                          auVar39 = vmovdqa64_avx512f(*pauVar30);
                          auVar3 = vmovdqa64_avx512f(auVar39);
                          pMVar24->data = (void *)auVar3._0_8_;
                          pMVar24->refcount = (int *)auVar3._8_8_;
                          pMVar24->elemsize = auVar3._16_8_;
                          pMVar24->elempack = auVar3._24_4_;
                          *(int *)&pMVar24->field_0x1c = auVar3._28_4_;
                          pMVar24->allocator = (Allocator *)auVar3._32_8_;
                          pMVar24->dims = auVar3._40_4_;
                          pMVar24->w = auVar3._44_4_;
                          pMVar24->h = auVar3._48_4_;
                          pMVar24->d = auVar3._52_4_;
                          pMVar24->c = auVar3._56_4_;
                          *(int *)&pMVar24->field_0x3c = auVar3._60_4_;
                          pauVar30 = pauVar30 + 1;
                          pMVar24 = (Mat *)&pMVar24->cstep;
                          iVar26 = iVar26 + 1;
                        } while (iVar26 < (int)fStack_154);
                      }
                      iVar26 = iVar16;
                      if (0 < iVar16) {
                        do {
                          auVar3 = vmovdqa64_avx512f(auVar39);
                          pMVar24->data = (void *)auVar3._0_8_;
                          pMVar24->refcount = (int *)auVar3._8_8_;
                          pMVar24->elemsize = auVar3._16_8_;
                          pMVar24->elempack = auVar3._24_4_;
                          *(int *)&pMVar24->field_0x1c = auVar3._28_4_;
                          pMVar24->allocator = (Allocator *)auVar3._32_8_;
                          pMVar24->dims = auVar3._40_4_;
                          pMVar24->w = auVar3._44_4_;
                          pMVar24->h = auVar3._48_4_;
                          pMVar24->d = auVar3._52_4_;
                          pMVar24->c = auVar3._56_4_;
                          *(int *)&pMVar24->field_0x3c = auVar3._60_4_;
                          pMVar24 = (Mat *)&pMVar24->cstep;
                          iVar26 = iVar26 + -1;
                        } while (iVar26 != 0);
                      }
                      iVar14 = iVar14 + 1;
                    } while (iVar14 != iVar15);
                  }
                }
                if ((this->super_Padding).type == 2) {
                  iVar14 = (this->super_Padding).top;
                  iVar15 = (this->super_Padding).bottom;
                  local_100._0_4_ = iVar15;
                  uVar25 = (this->super_Padding).left;
                  uVar37 = (ulong)uVar25;
                  uVar32 = (this->super_Padding).right;
                  uVar17 = (ulong)uVar32;
                  pauVar36 = (undefined1 (*) [64])
                             ((long)(iVar14 * (int)fStack_154 * 0x10) * 4 + (long)local_180);
                  if (0 < iVar14) {
                    iVar31 = 0;
                    do {
                      lVar18 = uVar37 << 6;
                      if (0 < (int)uVar25) {
                        do {
                          auVar39 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar36 + lVar18));
                          auVar39 = vmovdqa64_avx512f(auVar39);
                          pMVar22->data = (void *)auVar39._0_8_;
                          pMVar22->refcount = (int *)auVar39._8_8_;
                          pMVar22->elemsize = auVar39._16_8_;
                          pMVar22->elempack = auVar39._24_4_;
                          *(int *)&pMVar22->field_0x1c = auVar39._28_4_;
                          pMVar22->allocator = (Allocator *)auVar39._32_8_;
                          pMVar22->dims = auVar39._40_4_;
                          pMVar22->w = auVar39._44_4_;
                          pMVar22->h = auVar39._48_4_;
                          pMVar22->d = auVar39._52_4_;
                          pMVar22->c = auVar39._56_4_;
                          *(int *)&pMVar22->field_0x3c = auVar39._60_4_;
                          pMVar22 = (Mat *)&pMVar22->cstep;
                          lVar18 = lVar18 + -0x40;
                        } while (lVar18 != 0);
                      }
                      pauVar30 = pauVar36;
                      if (0 < (int)fStack_154) {
                        iVar16 = 0;
                        do {
                          auVar39 = vmovdqa64_avx512f(*pauVar30);
                          auVar39 = vmovdqa64_avx512f(auVar39);
                          pMVar22->data = (void *)auVar39._0_8_;
                          pMVar22->refcount = (int *)auVar39._8_8_;
                          pMVar22->elemsize = auVar39._16_8_;
                          pMVar22->elempack = auVar39._24_4_;
                          *(int *)&pMVar22->field_0x1c = auVar39._28_4_;
                          pMVar22->allocator = (Allocator *)auVar39._32_8_;
                          pMVar22->dims = auVar39._40_4_;
                          pMVar22->w = auVar39._44_4_;
                          pMVar22->h = auVar39._48_4_;
                          pMVar22->d = auVar39._52_4_;
                          pMVar22->c = auVar39._56_4_;
                          *(int *)&pMVar22->field_0x3c = auVar39._60_4_;
                          pauVar30 = pauVar30 + 1;
                          pMVar22 = (Mat *)&pMVar22->cstep;
                          iVar16 = iVar16 + 1;
                        } while (iVar16 < (int)fStack_154);
                      }
                      if (0 < (int)uVar32) {
                        lVar18 = -0x80;
                        do {
                          auVar39 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar30 + lVar18));
                          auVar39 = vmovdqa64_avx512f(auVar39);
                          pMVar22->data = (void *)auVar39._0_8_;
                          pMVar22->refcount = (int *)auVar39._8_8_;
                          pMVar22->elemsize = auVar39._16_8_;
                          pMVar22->elempack = auVar39._24_4_;
                          *(int *)&pMVar22->field_0x1c = auVar39._28_4_;
                          pMVar22->allocator = (Allocator *)auVar39._32_8_;
                          pMVar22->dims = auVar39._40_4_;
                          pMVar22->w = auVar39._44_4_;
                          pMVar22->h = auVar39._48_4_;
                          pMVar22->d = auVar39._52_4_;
                          pMVar22->c = auVar39._56_4_;
                          *(int *)&pMVar22->field_0x3c = auVar39._60_4_;
                          pMVar22 = (Mat *)&pMVar22->cstep;
                          lVar2 = uVar17 * 0x40 + lVar18;
                          lVar18 = lVar18 + -0x40;
                        } while (lVar2 != -0x40);
                      }
                      pauVar36 = (undefined1 (*) [64])
                                 ((long)pauVar36 + (long)((int)fStack_154 << 4) * -4);
                      iVar31 = iVar31 + 1;
                    } while (iVar31 != iVar14);
                  }
                  if (0 < (int)fStack_150) {
                    iVar14 = 0;
                    do {
                      lVar18 = uVar37 << 6;
                      if (0 < (int)uVar25) {
                        do {
                          auVar39 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar36 + lVar18));
                          auVar39 = vmovdqa64_avx512f(auVar39);
                          pMVar22->data = (void *)auVar39._0_8_;
                          pMVar22->refcount = (int *)auVar39._8_8_;
                          pMVar22->elemsize = auVar39._16_8_;
                          pMVar22->elempack = auVar39._24_4_;
                          *(int *)&pMVar22->field_0x1c = auVar39._28_4_;
                          pMVar22->allocator = (Allocator *)auVar39._32_8_;
                          pMVar22->dims = auVar39._40_4_;
                          pMVar22->w = auVar39._44_4_;
                          pMVar22->h = auVar39._48_4_;
                          pMVar22->d = auVar39._52_4_;
                          pMVar22->c = auVar39._56_4_;
                          *(int *)&pMVar22->field_0x3c = auVar39._60_4_;
                          pMVar22 = (Mat *)&pMVar22->cstep;
                          lVar18 = lVar18 + -0x40;
                        } while (lVar18 != 0);
                      }
                      if (0 < (int)fStack_154) {
                        iVar31 = 0;
                        do {
                          auVar39 = vmovdqa64_avx512f(*pauVar36);
                          auVar39 = vmovdqa64_avx512f(auVar39);
                          pMVar22->data = (void *)auVar39._0_8_;
                          pMVar22->refcount = (int *)auVar39._8_8_;
                          pMVar22->elemsize = auVar39._16_8_;
                          pMVar22->elempack = auVar39._24_4_;
                          *(int *)&pMVar22->field_0x1c = auVar39._28_4_;
                          pMVar22->allocator = (Allocator *)auVar39._32_8_;
                          pMVar22->dims = auVar39._40_4_;
                          pMVar22->w = auVar39._44_4_;
                          pMVar22->h = auVar39._48_4_;
                          pMVar22->d = auVar39._52_4_;
                          pMVar22->c = auVar39._56_4_;
                          *(int *)&pMVar22->field_0x3c = auVar39._60_4_;
                          pauVar36 = pauVar36 + 1;
                          pMVar22 = (Mat *)&pMVar22->cstep;
                          iVar31 = iVar31 + 1;
                        } while (iVar31 < (int)fStack_154);
                      }
                      if (0 < (int)uVar32) {
                        lVar18 = -0x80;
                        do {
                          auVar39 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar36 + lVar18));
                          auVar39 = vmovdqa64_avx512f(auVar39);
                          pMVar22->data = (void *)auVar39._0_8_;
                          pMVar22->refcount = (int *)auVar39._8_8_;
                          pMVar22->elemsize = auVar39._16_8_;
                          pMVar22->elempack = auVar39._24_4_;
                          *(int *)&pMVar22->field_0x1c = auVar39._28_4_;
                          pMVar22->allocator = (Allocator *)auVar39._32_8_;
                          pMVar22->dims = auVar39._40_4_;
                          pMVar22->w = auVar39._44_4_;
                          pMVar22->h = auVar39._48_4_;
                          pMVar22->d = auVar39._52_4_;
                          pMVar22->c = auVar39._56_4_;
                          *(int *)&pMVar22->field_0x3c = auVar39._60_4_;
                          pMVar22 = (Mat *)&pMVar22->cstep;
                          lVar2 = uVar17 * 0x40 + lVar18;
                          lVar18 = lVar18 + -0x40;
                        } while (lVar2 != -0x40);
                      }
                      iVar14 = iVar14 + 1;
                    } while (iVar14 < (int)fStack_150);
                  }
                  if (0 < iVar15) {
                    uVar23 = (ulong)(int)fStack_154;
                    pauVar36 = pauVar36 + uVar23 * -2;
                    iVar14 = 0;
                    do {
                      lVar18 = uVar37 << 6;
                      if (0 < (int)uVar25) {
                        do {
                          auVar39 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar36 + lVar18));
                          auVar39 = vmovdqa64_avx512f(auVar39);
                          pMVar22->data = (void *)auVar39._0_8_;
                          pMVar22->refcount = (int *)auVar39._8_8_;
                          pMVar22->elemsize = auVar39._16_8_;
                          pMVar22->elempack = auVar39._24_4_;
                          *(int *)&pMVar22->field_0x1c = auVar39._28_4_;
                          pMVar22->allocator = (Allocator *)auVar39._32_8_;
                          pMVar22->dims = auVar39._40_4_;
                          pMVar22->w = auVar39._44_4_;
                          pMVar22->h = auVar39._48_4_;
                          pMVar22->d = auVar39._52_4_;
                          pMVar22->c = auVar39._56_4_;
                          *(int *)&pMVar22->field_0x3c = auVar39._60_4_;
                          pMVar22 = (Mat *)&pMVar22->cstep;
                          lVar18 = lVar18 + -0x40;
                        } while (lVar18 != 0);
                        uVar23 = (ulong)(uint)fStack_154;
                      }
                      pauVar30 = pauVar36;
                      if (0 < (int)uVar23) {
                        iVar31 = 0;
                        do {
                          auVar39 = vmovdqa64_avx512f(*pauVar30);
                          auVar39 = vmovdqa64_avx512f(auVar39);
                          pMVar22->data = (void *)auVar39._0_8_;
                          pMVar22->refcount = (int *)auVar39._8_8_;
                          pMVar22->elemsize = auVar39._16_8_;
                          pMVar22->elempack = auVar39._24_4_;
                          *(int *)&pMVar22->field_0x1c = auVar39._28_4_;
                          pMVar22->allocator = (Allocator *)auVar39._32_8_;
                          pMVar22->dims = auVar39._40_4_;
                          pMVar22->w = auVar39._44_4_;
                          pMVar22->h = auVar39._48_4_;
                          pMVar22->d = auVar39._52_4_;
                          pMVar22->c = auVar39._56_4_;
                          *(int *)&pMVar22->field_0x3c = auVar39._60_4_;
                          pauVar30 = pauVar30 + 1;
                          pMVar22 = (Mat *)&pMVar22->cstep;
                          iVar31 = iVar31 + 1;
                          uVar23 = (ulong)(uint)fStack_154;
                        } while (iVar31 < (int)fStack_154);
                      }
                      if (0 < (int)uVar32) {
                        lVar18 = -0x80;
                        do {
                          auVar39 = vmovdqa64_avx512f(*(undefined1 (*) [64])(*pauVar30 + lVar18));
                          auVar39 = vmovdqa64_avx512f(auVar39);
                          pMVar22->data = (void *)auVar39._0_8_;
                          pMVar22->refcount = (int *)auVar39._8_8_;
                          pMVar22->elemsize = auVar39._16_8_;
                          pMVar22->elempack = auVar39._24_4_;
                          *(int *)&pMVar22->field_0x1c = auVar39._28_4_;
                          pMVar22->allocator = (Allocator *)auVar39._32_8_;
                          pMVar22->dims = auVar39._40_4_;
                          pMVar22->w = auVar39._44_4_;
                          pMVar22->h = auVar39._48_4_;
                          pMVar22->d = auVar39._52_4_;
                          pMVar22->c = auVar39._56_4_;
                          *(int *)&pMVar22->field_0x3c = auVar39._60_4_;
                          pMVar22 = (Mat *)&pMVar22->cstep;
                          lVar2 = uVar17 * 0x40 + lVar18;
                          lVar18 = lVar18 + -0x40;
                        } while (lVar2 != -0x40);
                        uVar23 = (ulong)(uint)fStack_154;
                      }
                      pauVar36 = (undefined1 (*) [64])
                                 ((long)pauVar36 + (long)((int)uVar23 << 4) * -4);
                      iVar14 = iVar14 + 1;
                    } while (iVar14 != iVar15);
                  }
                }
                if (uStack_178 != (int *)0x0) {
                  LOCK();
                  *uStack_178 = *uStack_178 + -1;
                  UNLOCK();
                  if (*uStack_178 == 0) {
                    if (pAStack_160 == (Allocator *)0x0) {
                      if (local_180 != (undefined1  [8])0x0) {
                        free((void *)local_180);
                      }
                    }
                    else {
                      (*pAStack_160->_vptr_Allocator[3])();
                    }
                  }
                }
              }
              uVar34 = uVar34 + 1;
            } while (uVar34 != local_108);
            return 0;
          }
          return -100;
        }
        goto LAB_004071a6;
      case 4:
        iVar15 = 4;
        if ((this->super_Padding).type == 0) {
          uVar33 = uVar33 + iVar14 + iVar26;
          Mat::create(top_blob,uVar4 + uVar27 + iVar31,uVar25 + uVar32 + iVar16,uVar33,_c,uVar34,
                      0x10,opt->blob_allocator);
          if (top_blob->data == (void *)0x0) {
            return -100;
          }
          if ((long)top_blob->c * top_blob->cstep != 0) {
            if ((int)_c < 1) {
              return 0;
            }
            local_108 = (ulong)_c;
            uVar34 = 0;
            do {
              if ((this->super_Padding).per_channel_pad_data_size == 0) {
                auVar39 = vpbroadcastd_avx512f(ZEXT416((uint)(this->super_Padding).value));
              }
              else {
                auVar39 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                             ((long)(this->super_Padding).per_channel_pad_data.data
                                             + uVar34 * 0x40));
              }
              _local_c0 = (Option)vmovdqa64_avx512f(auVar39);
              if (0 < (int)uVar33) {
                uVar37 = 0;
                local_100 = vmovdqa64_avx512f(auVar39);
                do {
                  afVar10 = _local_180;
                  uVar17 = (long)top_blob->h * (long)top_blob->w;
                  pMVar22 = (Mat *)((long)top_blob->data +
                                   top_blob->elemsize * uVar37 * uVar17 +
                                   top_blob->cstep * uVar34 * top_blob->elemsize);
                  uVar25 = (int)uVar37 - (this->super_Padding).front;
                  if ((int)uVar25 < 0 || iVar26 <= (int)uVar25) {
                    if (0 < (int)uVar17) {
                      do {
                        auVar3 = vmovdqu64_avx512f(auVar39);
                        pMVar22->data = (void *)auVar3._0_8_;
                        pMVar22->refcount = (int *)auVar3._8_8_;
                        pMVar22->elemsize = auVar3._16_8_;
                        pMVar22->elempack = auVar3._24_4_;
                        *(int *)&pMVar22->field_0x1c = auVar3._28_4_;
                        pMVar22->allocator = (Allocator *)auVar3._32_8_;
                        pMVar22->dims = auVar3._40_4_;
                        pMVar22->w = auVar3._44_4_;
                        pMVar22->h = auVar3._48_4_;
                        pMVar22->d = auVar3._52_4_;
                        pMVar22->c = auVar3._56_4_;
                        *(int *)&pMVar22->field_0x3c = auVar3._60_4_;
                        pMVar22 = (Mat *)&pMVar22->cstep;
                        uVar25 = (int)uVar17 - 1;
                        uVar17 = (ulong)uVar25;
                      } while (uVar25 != 0);
                    }
                  }
                  else {
                    sVar6 = local_110->elemsize;
                    local_140 = (long)local_110->h * (long)local_110->w;
                    uStack_178._0_4_ = 0.0;
                    uStack_178._4_4_ = 0.0;
                    local_180 = (undefined1  [8])
                                ((long)local_110->data +
                                uVar25 * sVar6 * local_140 + local_110->cstep * uVar34 * sVar6);
                    uStack_170._0_4_ = (float)(int)sVar6;
                    uStack_170._4_4_ = (float)(int)(sVar6 >> 0x20);
                    _fStack_164 = afVar10._28_36_;
                    fStack_168 = (float)local_110->elempack;
                    pAStack_160 = local_110->allocator;
                    iStack_158 = 2;
                    fStack_154 = (float)local_110->w;
                    fStack_150 = (float)local_110->h;
                    fStack_144 = afVar10[0xf];
                    uStack_14c._0_4_ = 1.4013e-45;
                    uStack_14c._4_4_ = 1.4013e-45;
                    padding_constant_pack16_avx512
                              ((ncnn *)local_180,pMVar22,(Mat *)(long)top_blob->w,
                               (this->super_Padding).top,(this->super_Padding).bottom,
                               (this->super_Padding).left,(this->super_Padding).right,
                               (__m512 *)local_c0);
                    auVar39 = vmovdqa64_avx512f(local_100);
                  }
                  uVar37 = uVar37 + 1;
                } while (uVar37 != uVar33);
              }
              uVar34 = uVar34 + 1;
            } while (uVar34 != local_108);
            return 0;
          }
          return -100;
        }
      }
    }
  }
  piVar5 = bottom_blob->refcount;
  uVar7 = bottom_blob->data;
  uVar8 = bottom_blob->refcount;
  uStack_178 = (int *)uVar8;
  local_180 = (undefined1  [8])uVar7;
  uStack_170._0_4_ = (float)(int)uVar34;
  uStack_170._4_4_ = (float)(int)(uVar34 >> 0x20);
  _fStack_164 = afVar10._28_36_;
  fStack_168 = (float)iVar20;
  pAStack_160 = bottom_blob->allocator;
  iStack_158 = iVar15;
  fStack_154 = (float)iVar31;
  fStack_150 = (float)iVar16;
  uStack_14c._0_4_ = (float)iVar26;
  fStack_144 = afVar10[0xf];
  uStack_14c._4_4_ = (float)_c;
  local_140 = bottom_blob->cstep;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
  }
  if (iVar20 != 1) {
    auVar39 = vmovdqu64_avx512f((undefined1  [64])*opt);
    auVar39 = vmovdqa64_avx512f(auVar39);
    auStack_b0 = auVar39._16_48_;
    local_c0 = auVar39._0_8_;
    uStack_b8 = opt->workspace_allocator;
    convert_packing(bottom_blob,(Mat *)local_180,1,(Option *)local_c0);
    if ((local_180 == (undefined1  [8])0x0) || ((long)(int)uStack_14c._4_4_ * local_140 == 0)) {
      iVar14 = -100;
      goto LAB_00406899;
    }
  }
  iVar14 = Padding::forward(&this->super_Padding,(Mat *)local_180,top_blob,opt);
LAB_00406899:
  if (uStack_178 != (int *)0x0) {
    LOCK();
    *uStack_178 = *uStack_178 + -1;
    UNLOCK();
    if (*uStack_178 == 0) {
      if (pAStack_160 == (Allocator *)0x0) {
        if (local_180 != (undefined1  [8])0x0) {
          free((void *)local_180);
        }
      }
      else {
        (*pAStack_160->_vptr_Allocator[3])();
      }
    }
  }
  return iVar14;
}

Assistant:

int Padding_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (top == 0 && bottom == 0 && left == 0 && right == 0 && front == 0 && behind == 0)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 16 == 0 ? 16 : outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, 0, 0, left / 16, right / 16, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 16 == 0 && out_elempack == 16 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m512 pad_value = _mm512_set1_ps(value);
                padding_constant_pack16_avx512(bottom_blob, top_blob, top / 16, bottom / 16, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 16 == 0 ? 16 : outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 16 == 0 && out_elempack == 16 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack16_avx512(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack16_avx512(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m512 pad_value = per_channel_pad_data_size ? _mm512_loadu_ps((const float*)per_channel_pad_data + q * 16) : _mm512_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack16_avx512(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m256 pad_value = _mm256_set1_ps(value);
                padding_constant_pack8_avx(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_avx(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_avx(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m256 pad_value = per_channel_pad_data_size ? _mm256_loadu_ps((const float*)per_channel_pad_data + q * 8) : _mm256_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_avx(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

#if __AVX__
            int out_elempack = outw % 8 == 0 ? 8 : outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, 0, 0, left / 4, right / 4, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

#if __AVX__
            int out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 4 == 0 && out_elempack == 4 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                __m128 pad_value = _mm_set1_ps(value);
                padding_constant_pack4_sse(bottom_blob, top_blob, top / 4, bottom / 4, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

#if __AVX__
            int out_elempack = outc % 8 == 0 ? 8 : outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 4 == 0 && out_elempack == 4 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);
                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack4_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack4_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    __m128 pad_value = per_channel_pad_data_size ? _mm_loadu_ps((const float*)per_channel_pad_data + q * 4) : _mm_set1_ps(value);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack4_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
        if (bottom_blob_unpacked.empty())
            return -100;
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}